

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_lite_unittest.pb.cc
# Opt level: O2

bool proto2_unittest::MapEnumLite_Parse(string_view name,MapEnumLite *value)

{
  bool bVar1;
  int *in_R9;
  string_view name_00;
  int int_value;
  
  name_00._M_str = (char *)&int_value;
  name_00._M_len = (size_t)name._M_str;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)MapEnumLite_entries,(EnumEntry *)0x3,name._M_len,name_00,in_R9);
  if (bVar1) {
    *value = int_value;
  }
  return bVar1;
}

Assistant:

bool MapEnumLite_Parse(::absl::string_view name, MapEnumLite* PROTOBUF_NONNULL value) {
  int int_value;
  bool success = ::google::protobuf::internal::LookUpEnumValue(
      MapEnumLite_entries, 3, name, &int_value);
  if (success) {
    *value = static_cast<MapEnumLite>(int_value);
  }
  return success;
}